

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VMake(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  char *__s;
  
  if (X == (N_Vector)0x0) {
    __s = "    After N_VMakeEmpty, X == NULL \n ";
  }
  else {
    iVar1 = has_data(X);
    if (iVar1 != 0) {
      iVar1 = 0;
      if (myid != 0) {
        return 0;
      }
      __s = "PASSED test -- N_VMake ";
      goto LAB_0010298a;
    }
    __s = "    Vector data == NULL \n ";
  }
  printf(">>> FAILED test -- N_VMake, Proc %d \n",(ulong)(uint)myid);
  iVar1 = 1;
LAB_0010298a:
  puts(__s);
  return iVar1;
}

Assistant:

int Test_N_VMake(N_Vector X, sunindextype local_length, int myid)
{
  /* check if vector is NULL */
  if (X == NULL) {
    printf(">>> FAILED test -- N_VMake, Proc %d \n", myid);
    printf("    After N_VMakeEmpty, X == NULL \n \n");
    return(1);
  }

  /* check for vector data */
  if (!has_data(X)) {
    printf(">>> FAILED test -- N_VMake, Proc %d \n", myid);
    printf("    Vector data == NULL \n \n");
    return(1);
  }

  if (myid == 0)
    printf("PASSED test -- N_VMake \n");

  return(0);
}